

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# screen_edge_lock.hpp
# Opt level: O2

tuple<double,_double,_double> * __thiscall
ear::ScreenEdgeLockHandler::handleVector
          (tuple<double,_double,_double> *__return_storage_ptr__,ScreenEdgeLockHandler *this,
          Vector3d *pos,ScreenEdgeLock *screenEdgeLock)

{
  undefined1 auVar1 [16];
  _Tuple_impl<1UL,_double,_double> _Var2;
  not_implemented *this_00;
  allocator<char> local_39;
  string local_38;
  
  if (((screenEdgeLock->horizontal).super_type.m_initialized == false) &&
     ((screenEdgeLock->vertical).super_type.m_initialized != true)) {
    auVar1 = *(undefined1 (*) [16])
              ((pos->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
               array + 1);
    _Var2.super__Head_base<1UL,_double,_false>._M_head_impl._0_4_ = auVar1._0_4_;
    _Var2.super__Tuple_impl<2UL,_double>.super__Head_base<2UL,_double,_false>._M_head_impl =
         (_Head_base<2UL,_double,_false>)(_Head_base<2UL,_double,_false>)auVar1._8_8_;
    _Var2.super__Head_base<1UL,_double,_false>._M_head_impl._4_4_ = auVar1._4_4_;
    (__return_storage_ptr__->super__Tuple_impl<0UL,_double,_double,_double>).
    super__Tuple_impl<1UL,_double,_double> = _Var2;
    (__return_storage_ptr__->super__Tuple_impl<0UL,_double,_double,_double>).
    super__Head_base<0UL,_double,_false>._M_head_impl =
         (pos->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array
         [0];
    return __return_storage_ptr__;
  }
  this_00 = (not_implemented *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"screenEdgeLock",&local_39)
  ;
  not_implemented::not_implemented(this_00,&local_38);
  __cxa_throw(this_00,&not_implemented::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

std::tuple<double, double, double> handleVector(
        Eigen::Vector3d pos, ScreenEdgeLock screenEdgeLock) {
      if (screenEdgeLock.horizontal || screenEdgeLock.vertical)
        throw not_implemented("screenEdgeLock");

      return std::make_tuple(pos(0), pos(1), pos(2));
    }